

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

Vec_Int_t * Pdr_InvCounts(Vec_Int_t *vInv)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  int *piVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  
  if ((long)vInv->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  piVar2 = vInv->pArray;
  iVar1 = piVar2[(long)vInv->nSize + -1];
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar6 << 2);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 << 2);
  }
  if (0 < *piVar2) {
    iVar6 = 0;
    piVar3 = piVar2;
    do {
      piVar5 = piVar3 + 1;
      iVar9 = *piVar5;
      if (0 < iVar9) {
        lVar7 = 0;
        do {
          if (piVar3[lVar7 + 2] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar8 = (uint)piVar3[lVar7 + 2] >> 1;
          if (iVar1 <= (int)uVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          __s[uVar8] = __s[uVar8] + 1;
          lVar7 = lVar7 + 1;
          iVar9 = *piVar5;
        } while (lVar7 < iVar9);
      }
      iVar6 = iVar6 + 1;
      piVar3 = piVar5 + iVar9;
    } while (iVar6 < *piVar2);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Pdr_InvCounts( Vec_Int_t * vInv )
{
    int i, k, * pCube, * pList = Vec_IntArray(vInv);
    Vec_Int_t * vCounts = Vec_IntStart( Vec_IntEntryLast(vInv) );
    Pdr_ForEachCube( pList, pCube, i )
        for ( k = 0; k < pCube[0]; k++ )
            Vec_IntAddToEntry( vCounts, Abc_Lit2Var(pCube[k+1]), 1 );
    return vCounts;
}